

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O2

dh_ctx * dh_setup_group(ssh_kex *kex)

{
  char *pcVar1;
  dh_ctx *ctx;
  
  pcVar1 = (char *)kex->extra;
  if (*pcVar1 != '\x01') {
    ctx = (dh_ctx *)safemalloc(1,0x28,0);
    (**(code **)(pcVar1 + 8))(ctx);
    dh_init(ctx);
    return ctx;
  }
  __assert_fail("!extra->gex",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/diffie-hellman.c"
                ,0xb3,"dh_ctx *dh_setup_group(const ssh_kex *)");
}

Assistant:

dh_ctx *dh_setup_group(const ssh_kex *kex)
{
    const struct dh_extra *extra = (const struct dh_extra *)kex->extra;
    assert(!extra->gex);
    dh_ctx *ctx = snew(dh_ctx);
    extra->construct(ctx);
    dh_init(ctx);
    return ctx;
}